

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expand_environment_variables.cpp
# Opt level: O0

string * __thiscall
tlx::expand_environment_variables_abi_cxx11_(string *__return_storage_ptr__,tlx *this,char *s)

{
  allocator local_1a;
  undefined1 local_19;
  tlx *local_18;
  char *s_local;
  string *copy;
  
  local_19 = 0;
  local_18 = this;
  s_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)this,&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  expand_environment_variables(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string expand_environment_variables(const char* s) {
    std::string copy = s;
    expand_environment_variables(&copy);
    return copy;
}